

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::DirectStateAccess::VertexArrays::VertexBuffersErrorsTest::iterate
          (VertexBuffersErrorsTest *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  ContextInfo *this_00;
  int local_78 [2];
  GLsizei invalid_stride_1;
  GLsizei invalid_stride_0;
  GLintptr invalid_offset;
  int local_54;
  int local_50;
  GLint max_vertex_attrib_stride;
  GLint max_vertex_attrib_bindings;
  GLsizei valid_stride;
  GLintptr valid_offset;
  GLuint not_a_bo;
  GLuint bo;
  GLuint not_a_vao;
  GLuint vao;
  bool is_error;
  bool is_ok;
  ApiType AStack_28;
  bool is_arb_direct_state_access;
  byte local_21;
  long lStack_20;
  bool is_at_least_gl_45;
  Functions *gl;
  VertexBuffersErrorsTest *this_local;
  
  gl = (Functions *)this;
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar3);
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  AStack_28.m_bits = (*pRVar5->_vptr_RenderContext[2])();
  vao = (GLuint)glu::ApiType::core(4,5);
  local_21 = glu::contextSupports((ContextType)AStack_28.m_bits,(ApiType)vao);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  not_a_vao._3_1_ = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if (((local_21 & 1) != 0) || ((bool)not_a_vao._3_1_)) {
    not_a_vao._2_1_ = 1;
    not_a_vao._1_1_ = 0;
    bo = 0;
    not_a_bo = 0;
    valid_offset._4_4_ = 0;
    valid_offset._0_4_ = 0;
    _max_vertex_attrib_bindings = 0;
    max_vertex_attrib_stride = 1;
    local_50 = 0x10;
    local_54 = 0x800;
    (**(code **)(lStack_20 + 0x410))(1,&bo);
    dVar4 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar4,"glCreateVertexArrays call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x11c4);
    (**(code **)(lStack_20 + 0x3b8))(1,(long)&valid_offset + 4);
    dVar4 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar4,"glCreateBuffers call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x11c7);
    do {
      not_a_bo = not_a_bo + 1;
      cVar1 = (**(code **)(lStack_20 + 0xcd8))();
    } while (cVar1 != '\0');
    do {
      valid_offset._0_4_ = (int)valid_offset + 1;
      cVar1 = (**(code **)(lStack_20 + 0xc68))();
    } while (cVar1 != '\0');
    (**(code **)(lStack_20 + 0x868))(0x82da,&local_50);
    (**(code **)(lStack_20 + 0x868))(0x82e5,&local_54);
    dVar4 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar4,"glGetIntegerv call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x11d2);
    _invalid_stride_1 = 0xffffffffffffffff;
    local_78[1] = 0xffffffff;
    local_78[0] = local_54 + 1;
    (**(code **)(lStack_20 + 0x1760))
              (not_a_bo,0,valid_offset._4_4_,_max_vertex_attrib_bindings,max_vertex_attrib_stride);
    bVar2 = CheckError(this,0x502,
                       "INVALID_OPERATION was not generated by VertexArrayVertexBuffer if vaobj is not the name of an existing vertex array object."
                      );
    not_a_vao._2_1_ = bVar2 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0x1768))
              (not_a_bo,0,1,(long)&valid_offset + 4,&max_vertex_attrib_bindings,
               &max_vertex_attrib_stride);
    bVar2 = CheckError(this,0x502,
                       "INVALID_OPERATION was not generated by VertexArrayVertexBuffers if vaobj is not the name of an existing vertex array object."
                      );
    not_a_vao._2_1_ = bVar2 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0x1760))
              (bo,0,(int)valid_offset,_max_vertex_attrib_bindings,max_vertex_attrib_stride);
    bVar2 = CheckError(this,0x502,
                       "INVALID_OPERATION was not generated by VertexArrayVertexBuffer if vaobj is not the name of an existing vertex array object."
                      );
    not_a_vao._2_1_ = bVar2 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0x1768))
              (bo,0,1,&valid_offset,&max_vertex_attrib_bindings,&max_vertex_attrib_stride);
    bVar2 = CheckError(this,0x502,
                       "INVALID_OPERATION was not generated by VertexArrayVertexBuffers if vaobj is not the name of an existing vertex array object."
                      );
    not_a_vao._2_1_ = bVar2 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0x1760))
              (bo,local_50,valid_offset._4_4_,_max_vertex_attrib_bindings,max_vertex_attrib_stride);
    bVar2 = CheckError(this,0x501,
                       "INVALID_VALUE was not generated by VertexArrayVertexBuffer if bindingindex is equal to the value of MAX_VERTEX_ATTRIB_BINDINGS."
                      );
    not_a_vao._2_1_ = bVar2 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0x1760))
              (bo,local_50 + 1,valid_offset._4_4_,_max_vertex_attrib_bindings,
               max_vertex_attrib_stride);
    bVar2 = CheckError(this,0x501,
                       "INVALID_VALUE was not generated by VertexArrayVertexBuffer if bindingindex is greater than the value of MAX_VERTEX_ATTRIB_BINDINGS."
                      );
    not_a_vao._2_1_ = bVar2 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0x1768))
              (bo,local_50,1,(long)&valid_offset + 4,&max_vertex_attrib_bindings,
               &max_vertex_attrib_stride);
    bVar2 = CheckError(this,0x502,
                       "INVALID_OPERATION was not generated by VertexArrayVertexBuffers if first+count is greater than the value of MAX_VERTEX_ATTRIB_BINDINGS."
                      );
    not_a_vao._2_1_ = bVar2 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0x1760))
              (bo,0,valid_offset._4_4_,0xffffffffffffffff,max_vertex_attrib_stride);
    bVar2 = CheckError(this,0x501,
                       "INVALID_VALUE is generated by VertexArrayVertexBuffer if offset less than zero."
                      );
    not_a_vao._2_1_ = bVar2 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0x1760))
              (bo,0,valid_offset._4_4_,_max_vertex_attrib_bindings,0xffffffff);
    bVar2 = CheckError(this,0x501,
                       "INVALID_VALUE is generated by VertexArrayVertexBuffer if stride is less than zero."
                      );
    not_a_vao._2_1_ = bVar2 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0x1760))
              (bo,0,valid_offset._4_4_,_max_vertex_attrib_bindings,local_54 + 1);
    bVar2 = CheckError(this,0x501,
                       "INVALID_VALUE is generated by VertexArrayVertexBuffer if stride is greater than the value of MAX_VERTEX_ATTRIB_STRIDE."
                      );
    not_a_vao._2_1_ = bVar2 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0x1768))
              (bo,0,1,(long)&valid_offset + 4,&invalid_stride_1,&max_vertex_attrib_stride);
    bVar2 = CheckError(this,0x501,
                       "INVALID_VALUE is generated by VertexArrayVertexBuffers if any value in offsets is negative."
                      );
    not_a_vao._2_1_ = bVar2 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0x1768))
              (bo,0,1,(long)&valid_offset + 4,&max_vertex_attrib_bindings,local_78 + 1);
    bVar2 = CheckError(this,0x501,
                       "INVALID_VALUE is generated by VertexArrayVertexBuffers if any value in strides is negative."
                      );
    not_a_vao._2_1_ = bVar2 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0x1768))
              (bo,0,1,(long)&valid_offset + 4,&max_vertex_attrib_bindings,local_78);
    bVar2 = CheckError(this,0x501,
                       "INVALID_VALUE is generated by VertexArrayVertexBuffers if a value in strides is greater than the value of MAX_VERTEX_ATTRIB_STRIDE."
                      );
    not_a_vao._2_1_ = (not_a_vao._2_1_ & 1 & bVar2) != 0;
    if (bo != 0) {
      (**(code **)(lStack_20 + 0x490))(1);
    }
    if (valid_offset._4_4_ != 0) {
      (**(code **)(lStack_20 + 0x438))(1);
    }
    do {
      iVar3 = (**(code **)(lStack_20 + 0x800))();
    } while (iVar3 != 0);
    if ((not_a_vao._2_1_ & 1) == 0) {
      if ((not_a_vao._1_1_ & 1) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_INTERNAL_ERROR,"Error");
      }
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult VertexBuffersErrorsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Tested Objects. */
	glw::GLuint vao		  = 0;
	glw::GLuint not_a_vao = 0;
	glw::GLuint bo		  = 0;
	glw::GLuint not_a_bo  = 0;

	/* Valid setup. */
	glw::GLintptr valid_offset = 0;
	glw::GLsizei  valid_stride = 1;

	/* Limits. (Minimum values - OpenGL 4.5 Core Specification, Table 23.55) */
	glw::GLint max_vertex_attrib_bindings = 16;
	glw::GLint max_vertex_attrib_stride   = 2048;

	try
	{
		/* Prepare valid Objects. */
		gl.createVertexArrays(1, &vao);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateVertexArrays call failed.");

		gl.createBuffers(1, &bo);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers call failed.");

		/* Prepare invalid VAO. */
		while (gl.isVertexArray(++not_a_vao))
			;
		while (gl.isBuffer(++not_a_bo))
			;

		/* Prepare limits. */
		gl.getIntegerv(GL_MAX_VERTEX_ATTRIB_BINDINGS, &max_vertex_attrib_bindings);
		gl.getIntegerv(GL_MAX_VERTEX_ATTRIB_STRIDE, &max_vertex_attrib_stride);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv call failed.");

		/* Invalid setup. */
		glw::GLintptr invalid_offset   = -1;
		glw::GLsizei  invalid_stride_0 = -1;
		glw::GLsizei  invalid_stride_1 = max_vertex_attrib_stride + 1;

		/* Test not a VAO. */
		gl.vertexArrayVertexBuffer(not_a_vao, 0, bo, valid_offset, valid_stride);

		is_ok &= CheckError(GL_INVALID_OPERATION, "INVALID_OPERATION was not generated by VertexArrayVertexBuffer if "
												  "vaobj is not the name of an existing vertex array object.");

		gl.vertexArrayVertexBuffers(not_a_vao, 0, 1, &bo, &valid_offset, &valid_stride);

		is_ok &= CheckError(GL_INVALID_OPERATION, "INVALID_OPERATION was not generated by VertexArrayVertexBuffers if "
												  "vaobj is not the name of an existing vertex array object.");

		/* Test not a BO. */
		gl.vertexArrayVertexBuffer(vao, 0, not_a_bo, valid_offset, valid_stride);

		is_ok &= CheckError(GL_INVALID_OPERATION, "INVALID_OPERATION was not generated by VertexArrayVertexBuffer if "
												  "vaobj is not the name of an existing vertex array object.");

		gl.vertexArrayVertexBuffers(vao, 0, 1, &not_a_bo, &valid_offset, &valid_stride);

		is_ok &= CheckError(GL_INVALID_OPERATION, "INVALID_OPERATION was not generated by VertexArrayVertexBuffers if "
												  "vaobj is not the name of an existing vertex array object.");

		/* Test too big binding index. */
		gl.vertexArrayVertexBuffer(vao, max_vertex_attrib_bindings, bo, valid_offset, valid_stride);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE was not generated by VertexArrayVertexBuffer if "
											  "bindingindex is equal to the value of MAX_VERTEX_ATTRIB_BINDINGS.");

		gl.vertexArrayVertexBuffer(vao, max_vertex_attrib_bindings + 1, bo, valid_offset, valid_stride);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE was not generated by VertexArrayVertexBuffer if "
											  "bindingindex is greater than the value of MAX_VERTEX_ATTRIB_BINDINGS.");

		gl.vertexArrayVertexBuffers(vao, max_vertex_attrib_bindings, 1, &bo, &valid_offset, &valid_stride);

		is_ok &=
			CheckError(GL_INVALID_OPERATION, "INVALID_OPERATION was not generated by VertexArrayVertexBuffers if "
											 "first+count is greater than the value of MAX_VERTEX_ATTRIB_BINDINGS.");

		/* Test too big stride. */
		gl.vertexArrayVertexBuffer(vao, 0, bo, -1, valid_stride);

		is_ok &= CheckError(GL_INVALID_VALUE,
							"INVALID_VALUE is generated by VertexArrayVertexBuffer if offset less than zero.");

		gl.vertexArrayVertexBuffer(vao, 0, bo, valid_offset, -1);

		is_ok &= CheckError(GL_INVALID_VALUE,
							"INVALID_VALUE is generated by VertexArrayVertexBuffer if stride is less than zero.");

		gl.vertexArrayVertexBuffer(vao, 0, bo, valid_offset, max_vertex_attrib_stride + 1);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE is generated by VertexArrayVertexBuffer if stride is "
											  "greater than the value of MAX_VERTEX_ATTRIB_STRIDE.");

		gl.vertexArrayVertexBuffers(vao, 0, 1, &bo, &invalid_offset, &valid_stride);

		is_ok &=
			CheckError(GL_INVALID_VALUE,
					   "INVALID_VALUE is generated by VertexArrayVertexBuffers if any value in offsets is negative.");

		gl.vertexArrayVertexBuffers(vao, 0, 1, &bo, &valid_offset, &invalid_stride_0);

		is_ok &=
			CheckError(GL_INVALID_VALUE,
					   "INVALID_VALUE is generated by VertexArrayVertexBuffers if any value in strides is negative.");

		gl.vertexArrayVertexBuffers(vao, 0, 1, &bo, &valid_offset, &invalid_stride_1);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE is generated by VertexArrayVertexBuffers if a value in "
											  "strides is greater than the value of MAX_VERTEX_ATTRIB_STRIDE.");
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Clean up. */
	if (vao)
	{
		gl.deleteVertexArrays(1, &vao);
	}

	if (bo)
	{
		gl.deleteBuffers(1, &bo);
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}